

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void writePrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,char *filename,NameSet *colnames,NameSet *rownames,bool real,bool rational,
               bool append)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  int iVar5;
  element_type *peVar6;
  void *pvVar7;
  char *pcVar8;
  ostream *poVar9;
  _Ios_Openmode in_ESI;
  byte in_R8B;
  byte in_R9B;
  Real RVar10;
  double dVar11;
  byte in_stack_00000008;
  int i_3;
  int nNonzeros_1;
  int i_2;
  VectorRational primal_1;
  int i_1;
  int nNonzeros;
  int i;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  ofstream outfile;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8b8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8c0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff908;
  undefined2 in_stack_fffffffffffff90c;
  undefined1 in_stack_fffffffffffff90e;
  undefined1 in_stack_fffffffffffff90f;
  ostream *in_stack_fffffffffffff910;
  ostream *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff948;
  byte in_stack_fffffffffffff94f;
  ostream *in_stack_fffffffffffff950;
  double in_stack_fffffffffffff9b8;
  ostream *in_stack_fffffffffffff9c0;
  undefined4 local_51c;
  undefined1 local_518 [76];
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  undefined4 local_4bc;
  undefined1 local_4b8 [68];
  int local_474;
  int local_454;
  int local_43c;
  int local_438;
  int local_434;
  undefined1 local_41c [128];
  int local_39c;
  int local_398;
  int local_394;
  int local_37c;
  int local_378;
  int local_374;
  undefined1 local_35c [128];
  int local_2dc;
  ostream local_2c0 [548];
  int local_9c;
  int local_98;
  byte local_93;
  byte local_92;
  byte local_91;
  _Ios_Openmode local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 *local_40;
  undefined1 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_91 = in_R8B & 1;
  local_92 = in_R9B & 1;
  local_93 = in_stack_00000008 & 1;
  local_80 = in_ESI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff8b8);
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x165e72);
  RVar10 = ::soplex::Tolerances::epsilon(peVar6);
  dVar11 = log10(RVar10);
  local_98 = (int)-dVar11;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x165ec2);
  local_9c = local_98 + 10;
  std::ofstream::ofstream(local_2c0);
  if ((local_93 & 1) == 0) {
    std::ofstream::open((char *)local_2c0,local_80);
  }
  else {
    std::ofstream::open((char *)local_2c0,local_80);
  }
  if ((local_91 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x165f80);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(in_stack_fffffffffffff8d0,(int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRay(in_stack_fffffffffffff8c8,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff8c0);
    if (bVar2) {
      std::operator<<(local_2c0,"\nPrimal ray (name, value):\n");
      for (local_2dc = 0; iVar1 = local_2dc,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x166009), iVar1 < iVar5; local_2dc = local_2dc + 1) {
        local_20 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff8c0,
                                (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
        local_18 = local_35c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff8c0,
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff8b8);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff8b8);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x166093);
        ::soplex::Tolerances::epsilon(peVar6);
        bVar2 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1660d2)
        ;
        if (bVar2) {
          pcVar8 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff8c0,
                              (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
          poVar9 = std::operator<<(local_2c0,pcVar8);
          poVar9 = std::operator<<(poVar9,"\t");
          local_374 = (int)std::setw(local_9c);
          poVar9 = std::operator<<(poVar9,(_Setw)local_374);
          local_378 = (int)std::setprecision(local_98);
          std::operator<<(poVar9,(_Setprecision)local_378);
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20))
          ;
          poVar9 = boost::multiprecision::operator<<
                             (in_stack_fffffffffffff950,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
      }
      poVar9 = std::operator<<(local_2c0,"All other entries are zero (within ");
      local_37c = (int)std::setprecision(1);
      poVar9 = std::operator<<(poVar9,(_Setprecision)local_37c);
      pvVar7 = (void *)std::ostream::operator<<(poVar9,std::scientific);
      ::soplex::
      SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances(in_stack_fffffffffffff8b8);
      peVar6 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1662d1);
      RVar10 = ::soplex::Tolerances::epsilon(peVar6);
      poVar9 = (ostream *)std::ostream::operator<<(pvVar7,RVar10);
      local_394 = (int)std::setprecision(8);
      poVar9 = std::operator<<(poVar9,(_Setprecision)local_394);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      poVar9 = std::operator<<(poVar9,").");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x166392);
    }
    else {
      bVar2 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isPrimalFeasible(in_stack_fffffffffffff8c0);
      if ((bVar2) &&
         (bVar2 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getPrimal(in_stack_fffffffffffff8c8,
                              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff8c0), bVar2)) {
        local_398 = 0;
        std::operator<<(local_2c0,"\nPrimal solution (name, value):\n");
        for (local_39c = 0; iVar1 = local_39c,
            iVar5 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x166458), iVar1 < iVar5; local_39c = local_39c + 1) {
          local_10 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff8c0,
                                  (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
          local_8 = local_41c;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff8c0,
                     (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff8b8);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff8b8);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1664e2);
          ::soplex::Tolerances::epsilon(peVar6);
          bVar2 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x166521);
          if (bVar2) {
            pcVar8 = ::soplex::NameSet::operator[]
                               ((NameSet *)in_stack_fffffffffffff8c0,
                                (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
            poVar9 = std::operator<<(local_2c0,pcVar8);
            poVar9 = std::operator<<(poVar9,"\t");
            local_434 = (int)std::setw(local_9c);
            poVar9 = std::operator<<(poVar9,(_Setw)local_434);
            local_438 = (int)std::setprecision(local_98);
            std::operator<<(poVar9,(_Setprecision)local_438);
            ::soplex::
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff8c0,
                         (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
            in_stack_fffffffffffff9c0 =
                 boost::multiprecision::operator<<
                           (in_stack_fffffffffffff950,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
            std::ostream::operator<<
                      (in_stack_fffffffffffff9c0,std::endl<char,std::char_traits<char>>);
            local_398 = local_398 + 1;
          }
        }
        poVar9 = std::operator<<(local_2c0,"All other variables are zero (within ");
        local_43c = (int)std::setprecision(1);
        poVar9 = std::operator<<(poVar9,(_Setprecision)local_43c);
        pvVar7 = (void *)std::ostream::operator<<(poVar9,std::scientific);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff8b8);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x166718);
        RVar10 = ::soplex::Tolerances::epsilon(peVar6);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar7,RVar10);
        local_454 = (int)std::setprecision(8);
        poVar9 = std::operator<<(poVar9,(_Setprecision)local_454);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
        poVar9 = std::operator<<(poVar9,"). Solution has ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_398);
        poVar9 = std::operator<<(poVar9," nonzero entries.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x166815)
        ;
      }
      else {
        std::operator<<(local_2c0,"No primal information available.\n");
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x166861);
  }
  if ((local_92 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x166890);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff8d0,(int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    bVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (in_stack_fffffffffffff8c8,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff8c0);
    if (bVar2) {
      std::operator<<(local_2c0,"\nPrimal ray (name, value):\n");
      for (local_474 = 0; iVar1 = local_474,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x166919), iVar1 < iVar5; local_474 = local_474 + 1) {
        in_stack_fffffffffffff950 =
             (ostream *)
             ::soplex::
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff8c0,
                          (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
        local_4bc = 0;
        local_58 = local_4b8;
        local_60 = &local_4bc;
        local_68 = 0;
        local_70 = 0;
        local_28 = local_60;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff918,(longlong *)in_stack_fffffffffffff910,
                   (type *)CONCAT17(in_stack_fffffffffffff90f,
                                    CONCAT16(in_stack_fffffffffffff90e,
                                             CONCAT24(in_stack_fffffffffffff90c,
                                                      in_stack_fffffffffffff908))));
        in_stack_fffffffffffff94f =
             boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)in_stack_fffffffffffff8b8,
                        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)0x1669e0);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1669f6);
        if ((in_stack_fffffffffffff94f & 1) != 0) {
          pcVar8 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff8c0,
                              (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
          poVar9 = std::operator<<(local_2c0,pcVar8);
          poVar9 = std::operator<<(poVar9,"\t");
          local_4c0 = (int)std::setw(local_9c);
          poVar9 = std::operator<<(poVar9,(_Setw)local_4c0);
          local_4c4 = (int)std::setprecision(local_98);
          std::operator<<(poVar9,(_Setprecision)local_4c4);
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20))
          ;
          in_stack_fffffffffffff918 =
               boost::multiprecision::operator<<
                         (in_stack_fffffffffffff950,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          std::ostream::operator<<(in_stack_fffffffffffff918,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      in_stack_fffffffffffff910 = std::operator<<(local_2c0,"All other entries are zero.");
      std::ostream::operator<<(in_stack_fffffffffffff910,std::endl<char,std::char_traits<char>>);
    }
    uVar3 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(in_stack_fffffffffffff8c0);
    if (((bool)uVar3) &&
       (uVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(in_stack_fffffffffffff8c8,
                                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff8c0), (bool)uVar4)) {
      local_4c8 = 0;
      std::operator<<(local_2c0,"\nPrimal solution (name, value):\n");
      for (local_4cc = 0; iVar1 = local_4cc,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0x166c04), iVar1 < iVar5; local_4cc = local_4cc + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
        local_51c = 0;
        local_38 = local_518;
        local_40 = &local_51c;
        local_48 = 0;
        local_50 = 0;
        local_30 = local_40;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff918,(longlong *)in_stack_fffffffffffff910,
                   (type *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff90c,iVar5)))
                  );
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff8b8,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x166cbc);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x166ccf);
        if (bVar2) {
          pcVar8 = ::soplex::NameSet::operator[]
                             ((NameSet *)in_stack_fffffffffffff8c0,
                              (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
          poVar9 = std::operator<<(local_2c0,pcVar8);
          std::operator<<(poVar9,"\t");
          ::soplex::
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20))
          ;
          poVar9 = boost::multiprecision::operator<<
                             (in_stack_fffffffffffff950,
                              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948));
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          local_4c8 = local_4c8 + 1;
        }
      }
      poVar9 = std::operator<<(local_2c0,"All other variables are zero. Solution has ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_4c8);
      poVar9 = std::operator<<(poVar9," nonzero entries.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::operator<<(local_2c0,"No primal (rational) solution available.\n");
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x166e37);
  }
  std::ofstream::~ofstream(local_2c0);
  return;
}

Assistant:

static
void writePrimalSolution(SoPlexBase<R>& soplex, const char* filename, NameSet& colnames,
                         NameSet& rownames,
                         bool real = true, bool rational = false, bool append = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;
   std::ofstream outfile;

   if(append)
      outfile.open(filename, std::ios::app);
   else
      outfile.open(filename);

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << ")." << std::endl;
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero (within "
                 << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                 << std::setprecision(8) << std::fixed
                 << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal information available.\n";
   }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         outfile <<  "\nPrimal ray (name, value):\n";

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t"
                       << std::setw(printwidth) << std::setprecision(printprec)
                       << primal[i] << std::endl;
            }
         }

         outfile <<  "All other entries are zero." << std::endl;
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         outfile <<  "\nPrimal solution (name, value):\n";

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               outfile <<  colnames[i] << "\t" << primal[i] << std::endl;
               ++nNonzeros;
            }
         }

         outfile <<  "All other variables are zero. Solution has "
                 << nNonzeros << " nonzero entries." << std::endl;
      }
      else
         outfile <<  "No primal (rational) solution available.\n";
   }
}